

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.h
# Opt level: O0

void gimage::getBoxMuller(double *ret1,double *ret2,double stddev)

{
  bool bVar1;
  int iVar2;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double s;
  double v;
  double u;
  
  do {
    iVar2 = rand();
    dVar3 = ((double)iVar2 * 2.0) / 2147483647.0 - 1.0;
    iVar2 = rand();
    dVar4 = ((double)iVar2 * 2.0) / 2147483647.0 - 1.0;
    dVar5 = dVar3 * dVar3 + dVar4 * dVar4;
    bVar1 = true;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      bVar1 = 1.0 <= dVar5;
    }
  } while (bVar1);
  dVar6 = log(dVar5);
  dVar5 = sqrt((dVar6 * -2.0) / dVar5);
  *in_RDI = dVar3 * dVar5 * in_XMM0_Qa;
  *in_RSI = dVar4 * dVar5 * in_XMM0_Qa;
  return;
}

Assistant:

inline void getBoxMuller(double &ret1, double &ret2, double stddev)
{
  double u, v, s;

  do
  {
    u=(2.0*rand())/RAND_MAX-1.0;
    v=(2.0*rand())/RAND_MAX-1.0;
    s=u*u+v*v;
  }
  while (s == 0 || s >= 1.0);

  s=sqrt(-2.0*log(s)/s);

  ret1=u*s*stddev;
  ret2=v*s*stddev;
}